

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_HistoryRecord::GetBoolValue(ON_HistoryRecord *this,int value_id,bool *b)

{
  int iVar1;
  ON_Value *pOVar2;
  bool *pbVar3;
  ON_BoolValue *v;
  bool rc;
  bool *b_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  pOVar2 = FindValueHelper(this,value_id,1,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<bool>::Count((ON_SimpleArray<bool> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      pbVar3 = ON_SimpleArray<bool>::operator[]((ON_SimpleArray<bool> *)(pOVar2 + 1),0);
      *b = (bool)(*pbVar3 & 1);
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetBoolValue( int value_id, bool* b ) const
{
  bool rc = false;
  const ON_BoolValue* v = static_cast<ON_BoolValue*>(FindValueHelper(value_id,ON_Value::bool_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    *b = v->m_value[0];
    rc = true;
  }
  return rc;
}